

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PtexSeparableFilter.h
# Opt level: O3

void __thiscall
Ptex::v2_4::PtexSeparableFilter::PtexSeparableFilter
          (PtexSeparableFilter *this,PtexTexture *tx,Options *opts)

{
  FilterType FVar1;
  bool bVar2;
  undefined3 uVar3;
  float fVar4;
  int iVar5;
  DataType DVar6;
  BorderMode BVar7;
  EdgeFilterMode EVar8;
  
  (this->super_PtexFilter)._vptr_PtexFilter = (_func_int **)&PTR__PtexFilter_00124d10;
  this->_tx = tx;
  FVar1 = opts->filter;
  bVar2 = opts->lerp;
  uVar3 = *(undefined3 *)&opts->field_0x9;
  fVar4 = opts->sharpness;
  (this->_options).__structSize = opts->__structSize;
  (this->_options).filter = FVar1;
  (this->_options).lerp = bVar2;
  *(undefined3 *)&(this->_options).field_0x9 = uVar3;
  (this->_options).sharpness = fVar4;
  uVar3 = *(undefined3 *)&opts->field_0x11;
  (this->_options).noedgeblend = opts->noedgeblend;
  *(undefined3 *)&(this->_options).field_0x11 = uVar3;
  this->_result = (float *)0x0;
  this->_weight = 0.0;
  this->_firstChanOffset = 0;
  this->_nchan = 0;
  iVar5 = (*tx->_vptr_PtexTexture[0xb])(tx);
  this->_ntxchan = iVar5;
  DVar6 = (*tx->_vptr_PtexTexture[6])(tx);
  this->_dt = DVar6;
  BVar7 = (*tx->_vptr_PtexTexture[7])(tx);
  this->_uMode = BVar7;
  BVar7 = (*tx->_vptr_PtexTexture[8])(tx);
  this->_vMode = BVar7;
  EVar8 = (*tx->_vptr_PtexTexture[9])(tx);
  this->_efm = EVar8;
  if ((this->_options).__structSize < 0x10) {
    (this->_options).noedgeblend = false;
  }
  return;
}

Assistant:

PtexSeparableFilter(PtexTexture* tx, const PtexFilter::Options& opts ) :
        _tx(tx), _options(opts), _result(0), _weight(0),
        _firstChanOffset(0), _nchan(0), _ntxchan(_tx->numChannels()),
        _dt(tx->dataType()), _uMode(tx->uBorderMode()), _vMode(tx->vBorderMode()),
        _efm(tx->edgeFilterMode())
    {
        // if caller was compiled with older version of struct, set default for new opts
        if (_options.__structSize < (char*)&_options.noedgeblend - (char*)&_options) {
            _options.noedgeblend = 0;
        }
    }